

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O0

void resampler_write_sample(void *_r,short s)

{
  int iVar1;
  short in_SI;
  resampler *in_RDI;
  float s32;
  resampler *r;
  
  if (in_RDI->delay_added < '\0') {
    in_RDI->delay_added = '\0';
    iVar1 = resampler_input_delay(in_RDI);
    in_RDI->write_filled = iVar1;
  }
  if (in_RDI->write_filled < 0x40) {
    in_RDI->buffer_in[in_RDI->write_pos] = (float)(int)in_SI * 256.0;
    in_RDI->buffer_in[in_RDI->write_pos + 0x40] = (float)(int)in_SI * 256.0;
    in_RDI->write_filled = in_RDI->write_filled + 1;
    in_RDI->write_pos = (in_RDI->write_pos + 1) % 0x40;
  }
  return;
}

Assistant:

void resampler_write_sample(void *_r, short s)
{
    resampler * r = ( resampler * ) _r;

    if ( r->delay_added < 0 )
    {
        r->delay_added = 0;
        r->write_filled = resampler_input_delay( r );
    }
    
    if ( r->write_filled < resampler_buffer_size )
    {
        float s32 = s;
        s32 *= 256.0;

        r->buffer_in[ r->write_pos ] = s32;
        r->buffer_in[ r->write_pos + resampler_buffer_size ] = s32;

        ++r->write_filled;

        r->write_pos = ( r->write_pos + 1 ) % resampler_buffer_size;
    }
}